

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

void base_extent_bump_alloc_post
               (base_t *base,extent_t *extent,size_t gap_size,void *addr,size_t size)

{
  _Bool _Var1;
  size_t sVar2;
  long in_RCX;
  long in_RDX;
  extent_t *in_RSI;
  long in_RDI;
  extent_heap_t *in_R8;
  szind_t index_floor;
  szind_t ret;
  undefined4 in_stack_ffffffffffffffb8;
  uint local_10;
  
  sVar2 = extent_bsize_get(in_RSI);
  if (sVar2 != 0) {
    sVar2 = extent_bsize_get(in_RSI);
    if (sVar2 + 1 < 0x1001) {
      local_10 = (uint)sz_size2index_tab[sVar2 + 8 >> 3];
    }
    else {
      local_10 = sz_size2index_compute(sVar2 + 1);
    }
    extent_heap_insert(in_R8,(extent_t *)CONCAT44(local_10 - 1,in_stack_ffffffffffffffb8));
  }
  *(long *)(in_RDI + 0x7d8) = (long)&in_R8->ph_root + *(long *)(in_RDI + 0x7d8);
  *(ulong *)(in_RDI + 0x7e0) =
       (((long)&in_R8[0x1ff].ph_root + in_RCX + 7 & 0xfffffffffffff000U) -
       ((in_RCX - in_RDX) + 0xfffU & 0xfffffffffffff000)) + *(long *)(in_RDI + 0x7e0);
  _Var1 = metadata_thp_madvise();
  if ((_Var1) &&
     ((opt_metadata_thp == metadata_thp_always || ((*(byte *)(in_RDI + 0x80) & 1) != 0)))) {
    *(ulong *)(in_RDI + 0x7f0) =
         (((long)&in_R8[0x3ffff].ph_root + in_RCX + 7 & 0xffffffffffe00000U) -
          ((in_RCX - in_RDX) + 0x1fffffU & 0xffffffffffe00000) >> 0x15) + *(long *)(in_RDI + 0x7f0);
  }
  return;
}

Assistant:

static void
base_extent_bump_alloc_post(base_t *base, extent_t *extent, size_t gap_size,
    void *addr, size_t size) {
	if (extent_bsize_get(extent) > 0) {
		/*
		 * Compute the index for the largest size class that does not
		 * exceed extent's size.
		 */
		szind_t index_floor =
		    sz_size2index(extent_bsize_get(extent) + 1) - 1;
		extent_heap_insert(&base->avail[index_floor], extent);
	}

	if (config_stats) {
		base->allocated += size;
		/*
		 * Add one PAGE to base_resident for every page boundary that is
		 * crossed by the new allocation. Adjust n_thp similarly when
		 * metadata_thp is enabled.
		 */
		base->resident += PAGE_CEILING((uintptr_t)addr + size) -
		    PAGE_CEILING((uintptr_t)addr - gap_size);
		assert(base->allocated <= base->resident);
		assert(base->resident <= base->mapped);
		if (metadata_thp_madvise() && (opt_metadata_thp ==
		    metadata_thp_always || base->auto_thp_switched)) {
			base->n_thp += (HUGEPAGE_CEILING((uintptr_t)addr + size)
			    - HUGEPAGE_CEILING((uintptr_t)addr - gap_size)) >>
			    LG_HUGEPAGE;
			assert(base->mapped >= base->n_thp << LG_HUGEPAGE);
		}
	}
}